

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pgraph_class_celsius.cc
# Opt level: O3

bool __thiscall hwtest::pgraph::MthdCelsiusConfig::is_valid_val(MthdCelsiusConfig *this)

{
  uint uVar1;
  
  uVar1 = (this->super_SingleMthdTest).super_MthdTest.val;
  if (((uVar1 & 0xceeeeefe) == 0) &&
     ((uVar1 < 0x10000000 || ((this->super_SingleMthdTest).super_MthdTest.cls == 0x99)))) {
    return (uVar1 & 0x10100) != 0x100;
  }
  return false;
}

Assistant:

bool is_valid_val() override {
		if (val & 0xceeeeefe)
			return false;
		if (extr(val, 28, 2) && cls != 0x99)
			return false;
		if (extr(val, 8, 1) && !extr(val, 16, 1))
			return false;
		return true;
	}